

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# op_queue.hpp
# Opt level: O2

void __thiscall
asio::detail::op_queue<asio::detail::wait_op>::pop(op_queue<asio::detail::wait_op> *this)

{
  wait_op *pwVar1;
  wait_op *pwVar2;
  wait_op *tmp;
  
  pwVar1 = this->front_;
  if (pwVar1 != (wait_op *)0x0) {
    pwVar2 = (wait_op *)(pwVar1->super_operation).next_;
    this->front_ = pwVar2;
    if (pwVar2 == (wait_op *)0x0) {
      this->back_ = (wait_op *)0x0;
    }
    (pwVar1->super_operation).next_ = (scheduler_operation *)0x0;
  }
  return;
}

Assistant:

void pop()
  {
    if (front_)
    {
      Operation* tmp = front_;
      front_ = op_queue_access::next(front_);
      if (front_ == 0)
        back_ = 0;
      op_queue_access::next(tmp, static_cast<Operation*>(0));
    }
  }